

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest-simpleweb.hh
# Opt level: O0

void __thiscall
discordpp::RestSimpleWeb<discordpp::Bot>::doCall
          (RestSimpleWeb<discordpp::Bot> *this,sptr<RenderedCall> *call)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer this_00;
  element_type *peVar5;
  element_type *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3f8;
  anon_class_16_1_898a275c_for_handler_ local_3c0;
  anon_class_56_3_fbde57b0 local_3b0;
  function<void_(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response>,_const_std::error_code_&)>
  local_378;
  byte local_352;
  allocator<char> local_351;
  string local_350 [32];
  string_view local_330;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d3;
  key_equal local_2d2;
  hasher local_2d1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  iterator local_208;
  size_type local_200;
  undefined1 local_1f8 [8];
  CaseInsensitiveMultimap headers;
  __string_type target;
  ostringstream local_190 [8];
  ostringstream targetss;
  sptr<RenderedCall> *call_local;
  RestSimpleWeb<discordpp::Bot> *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"/api/v");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,*(uint *)((long)&(this->super_Bot).shardID +
                                      (long)(this->super_Bot)._vptr_Bot[-3]));
  peVar3 = std::
           __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)call);
  peVar4 = std::
           __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&peVar3->target);
  std::operator<<(poVar2,(string *)peVar4);
  std::__cxx11::ostringstream::str();
  local_2d0 = &local_2c8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_2d0,(char (*) [14])"authorization",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(this->super_Bot).field_0x90 + (long)(this->super_Bot)._vptr_Bot[-3]));
  local_2d0 = &local_288;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[12],_true>
            (local_2d0,(char (*) [22])"X-RateLimit-Precision",(char (*) [12])"millisecond");
  local_2d0 = &local_248;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_2d0,(char (*) [11])"User-Agent",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&(this->super_Bot).field_0xb8 + (long)(this->super_Bot)._vptr_Bot[-3]));
  local_208 = &local_2c8;
  local_200 = 3;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_2d3);
  __l._M_len = local_200;
  __l._M_array = local_208;
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1f8,__l,0,&local_2d1,&local_2d2,&local_2d3);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_2d3);
  local_3f8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_208;
  do {
    local_3f8 = local_3f8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_3f8);
  } while (local_3f8 != &local_2c8);
  peVar3 = std::
           __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)call);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->type);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)call);
    peVar4 = std::
             __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&peVar3->type);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_true>(&local_318,(char (*) [13])"Content-Type",peVar4);
    local_320._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::insert((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1f8,&local_318);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_318);
  }
  this_00 = std::
            unique_ptr<SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>,_std::default_delete<SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>_>
            ::operator->((unique_ptr<SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>,_std::default_delete<SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>_>
                          *)&(this->super_Bot).field_0x80);
  peVar3 = std::
           __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)call);
  peVar4 = std::
           __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)peVar3);
  peVar3 = std::
           __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)call);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->body);
  local_352 = 0;
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)call);
    peVar5 = std::
             __shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&peVar3->body);
    std::__cxx11::string::string(local_350,(string *)peVar5);
  }
  else {
    std::allocator<char>::allocator();
    local_352 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_350,"",&local_351);
  }
  local_330 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_350);
  local_3b0.this = this;
  std::shared_ptr<discordpp::BotStruct::RenderedCall>::shared_ptr(&local_3b0.call,call);
  std::__cxx11::string::string((string *)&local_3b0.target,(string *)&headers._M_h._M_single_bucket)
  ;
  std::
  function<void(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)>
  ::
  function<discordpp::RestSimpleWeb<discordpp::Bot>::doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::_lambda(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)_1_,void>
            ((function<void(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)>
              *)&local_378,&local_3b0);
  SimpleWeb::
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
  request(&this_00->
           super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
          ,peVar4,(string *)&headers._M_h._M_single_bucket,local_330,
          (CaseInsensitiveMultimap *)local_1f8,&local_378);
  std::
  function<void_(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response>,_const_std::error_code_&)>
  ::~function(&local_378);
  doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::
  {lambda(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>,std::error_code_const&)#1}
  ::~error_code((_lambda_std__shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response>_std__error_code_const___1_
                 *)&local_3b0);
  std::__cxx11::string::~string(local_350);
  if ((local_352 & 1) != 0) {
    std::allocator<char>::~allocator(&local_351);
  }
  peVar3 = std::
           __shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)call);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->onWrite);
  if (bVar1) {
    this_01 = std::__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<asio::io_context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(&(this->super_Bot).field_0x80 + (long)(this->super_Bot)._vptr_Bot[-3]))
    ;
    std::shared_ptr<discordpp::BotStruct::RenderedCall>::shared_ptr(&local_3c0.call,call);
    asio::io_context::
    post<discordpp::RestSimpleWeb<discordpp::Bot>::doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::_lambda()_1_>
              (this_01,&local_3c0);
    doCall(std::shared_ptr<discordpp::BotStruct::RenderedCall>)::{lambda()#1}::~shared_ptr
              ((_lambda___1_ *)&local_3c0);
  }
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1f8);
  std::__cxx11::string::~string((string *)&headers._M_h._M_single_bucket);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void doCall(sptr<RenderedCall> call) override {
        std::ostringstream targetss;
        targetss << "/api/v" << apiVersion << *call->target;
        auto target = targetss.str();
        SimpleWeb::CaseInsensitiveMultimap headers{{"authorization", token},{"X-RateLimit-Precision", "millisecond"}, {"User-Agent", user_agent_}};
        if (call->type) {
            headers.insert({"Content-Type", *call->type});
        }
        client_->request(
            *call->method, target, call->body ? *call->body : "",
            headers,
            [this, call,
             target](std::shared_ptr<HttpsClient::Response> response,
                     const SimpleWeb::error_code &ec) {
                if (ec) {
                    if (call->onRead)
                        aioc->post([call] { (*call->onRead)(true, {}); });
                    return fail(ec, "read", call);
                }

                json jres;
                {
                    std::ostringstream ss;
                    ss << response->content.rdbuf();
                    const std::string &body = ss.str();
                    log::log(log::trace, [body](std::ostream *log) {
                        *log << "Received: " << body << '\n';
                    });
                    if (!body.empty()) {
                        if (body.at(0) == '{' || body.at(0) == '[') {
                            jres = {{"body", json::parse(body)}};
                        } else {
                            std::cerr
                                << "Discord replied:\n"
                                << ss.str() << "\nTo the following target:\n"
                                << target << "\nWith the following payload:\n"
                                << *call->body << std::endl;
                        }
                    }
                }

                int status = std::stoi(response->status_code);
                jres["result"] = status;

                for (auto h :
                     {"X-RateLimit-Global", "X-RateLimit-Limit",
                      "X-RateLimit-Remaining", "X-RateLimit-Reset",
                      "X-RateLimit-Reset-After", "X-RateLimit-Bucket"}) {
                    auto it = response->header.find(h);
                    if (it != response->header.end()) {
                        jres["header"][h] = it->second;
                    }
                }

                if (jres.find("embed") != jres.end()) {
                    std::cout << "Discord API didn't like the following parts "
                                 "of your "
                                 "embed: ";
                    bool first = true;
                    for (const json &part : jres["embed"]) {
                        if (first) {
                            first = false;
                        } else {
                            std::cout << ", ";
                        }
                        std::cout << part.get<std::string>();
                    }
                    std::cout << std::endl;
                }

                log::log(log::debug, [call, jres](std::ostream *log) {
                    *log << "Read " << call->target << jres.dump(4) << '\n';
                });

                if (status < 200 || status >= 300) {
                    log::log(log::error, [call, jres](std::ostream *log) {
                        *log << "Discord sent an error! " << call->target
                             << jres.dump(4) << '\n';
                    });
                }

                if (call->onRead) {
                    aioc->post([call, jres, status]() {
                        (*call->onRead)(status < 200 || status >= 300, jres);
                    });
                }
            });
        if (call->onWrite) {
            aioc->post([call]() {
                (*call->onWrite)(false);
            });
        }
    }